

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

void clamp_mv_ref(MV *mv,int bw,int bh,MACROBLOCKD *xd)

{
  long in_RCX;
  int in_EDX;
  int in_ESI;
  SubpelMvLimits mv_limits;
  
  clamp_mv((MV *)CONCAT44(*(int *)(in_RCX + 0x1f00) + in_EDX * 8 + 0x80,
                          *(int *)(in_RCX + 0x1efc) + in_EDX * -8 + -0x80),
           (SubpelMvLimits *)
           CONCAT44(*(int *)(in_RCX + 0x1ef8) + in_ESI * 8 + 0x80,
                    *(int *)(in_RCX + 0x1ef4) + in_ESI * -8 + -0x80));
  return;
}

Assistant:

static inline void clamp_mv_ref(MV *mv, int bw, int bh, const MACROBLOCKD *xd) {
  const SubpelMvLimits mv_limits = {
    xd->mb_to_left_edge - GET_MV_SUBPEL(bw) - MV_BORDER,
    xd->mb_to_right_edge + GET_MV_SUBPEL(bw) + MV_BORDER,
    xd->mb_to_top_edge - GET_MV_SUBPEL(bh) - MV_BORDER,
    xd->mb_to_bottom_edge + GET_MV_SUBPEL(bh) + MV_BORDER
  };
  clamp_mv(mv, &mv_limits);
}